

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzFuseFuseRace_Test::~ArenaTest_FuzzFuseFuseRace_Test
          (ArenaTest_FuzzFuseFuseRace_Test *this)

{
  ArenaTest_FuzzFuseFuseRace_Test *this_local;
  
  ~ArenaTest_FuzzFuseFuseRace_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, FuzzFuseFuseRace) {
  Environment env;

  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 10; ++i) {
    threads.emplace_back([&]() {
      absl::BitGen gen;
      while (!done.HasBeenNotified()) {
        env.RandomFuse(gen);
      }
    });
  }

  absl::BitGen gen;
  auto end = absl::Now() + absl::Seconds(2);
  while (absl::Now() < end) {
    env.RandomFuse(gen);
  }
  done.Notify();
  for (auto& t : threads) t.join();
}